

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateMemberAccess(ExpressionEvalContext *ctx,ExprMemberAccess *expression)

{
  uint uVar1;
  uchar *puVar2;
  SynBase *source;
  bool bVar3;
  StackFrame **ppSVar4;
  ExprBase *pEVar5;
  ExprPointerLiteral *pEVar6;
  TypeRef *type;
  ExprPointerLiteral *shifted;
  uchar *targetPtr;
  ExprPointerLiteral *ptr;
  ExprBase *value;
  ExprMemberAccess *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar3 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar3) &&
     (ppSVar4 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar4)->targetYield != 0)) {
    pEVar5 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar5,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar5;
  }
  bVar3 = AddInstruction(ctx);
  if (bVar3) {
    pEVar5 = Evaluate(ctx,expression->value);
    if (pEVar5 == (ExprBase *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      bVar3 = isType<ExprNullptrLiteral>(pEVar5);
      if (bVar3) {
        ctx_local = (ExpressionEvalContext *)Report(ctx,"ERROR: member access of null pointer");
      }
      else {
        pEVar6 = getType<ExprPointerLiteral>(pEVar5);
        if (pEVar6 == (ExprPointerLiteral *)0x0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x62a,
                        "ExprBase *EvaluateMemberAccess(ExpressionEvalContext &, ExprMemberAccess *)"
                       );
        }
        if (pEVar6->end <
            pEVar6->ptr +
            expression->member->variable->type->size + (ulong)expression->member->variable->offset)
        {
          __assert_fail("ptr->ptr + expression->member->variable->offset + expression->member->variable->type->size <= ptr->end"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x62b,
                        "ExprBase *EvaluateMemberAccess(ExpressionEvalContext &, ExprMemberAccess *)"
                       );
        }
        puVar2 = pEVar6->ptr;
        uVar1 = expression->member->variable->offset;
        pEVar6 = ExpressionContext::get<ExprPointerLiteral>(ctx->ctx);
        source = (expression->super_ExprBase).source;
        type = ExpressionContext::GetReferenceType(ctx->ctx,expression->member->variable->type);
        ExprPointerLiteral::ExprPointerLiteral
                  (pEVar6,source,&type->super_TypeBase,puVar2 + uVar1,
                   puVar2 + uVar1 + expression->member->variable->type->size);
        ctx_local = (ExpressionEvalContext *)
                    CheckType(&expression->super_ExprBase,&pEVar6->super_ExprBase);
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateMemberAccess(ExpressionEvalContext &ctx, ExprMemberAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(isType<ExprNullptrLiteral>(value))
		return Report(ctx, "ERROR: member access of null pointer");

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

	assert(ptr);
	assert(ptr->ptr + expression->member->variable->offset + expression->member->variable->type->size <= ptr->end);

	unsigned char *targetPtr = ptr->ptr + expression->member->variable->offset;

	ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(expression->member->variable->type), targetPtr, targetPtr + expression->member->variable->type->size);

	return CheckType(expression, shifted);
}